

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall lest::env::sections_abi_cxx11_(env *this)

{
  size_type sVar1;
  size_type sVar2;
  long in_RSI;
  string *in_RDI;
  size_t i;
  text msg;
  string local_90 [32];
  size_type local_70;
  string local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  allocator local_31;
  string local_30 [48];
  
  if ((*(byte *)(in_RSI + 0x12) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"",&local_31);
    std::__cxx11::string::string(in_RDI,local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    std::__cxx11::string::string(local_68);
    local_70 = 0;
    while( true ) {
      sVar1 = local_70;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RSI + 0x40));
      if (sVar1 == sVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 0x40),local_70);
      std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::__cxx11::string::operator+=(local_68,local_90);
      std::__cxx11::string::~string(local_90);
      local_70 = local_70 + 1;
    }
    std::__cxx11::string::string(in_RDI,local_68);
    std::__cxx11::string::~string(local_68);
  }
  return in_RDI;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( size_t i = 0; i != ctx.size(); ++i )
        {
            msg += "\n  " + ctx[i];
        }
        return msg;
    }